

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O1

void __thiscall
t_rb_generator::generate_rb_struct_declaration
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  ostream *poVar1;
  t_rb_generator *this_00;
  int iVar2;
  string local_48;
  
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  this_00 = (t_rb_generator *)0x399c84;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class ",6);
  type_name_abi_cxx11_(&local_48,this_00,&tstruct->super_t_type);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (tstruct->is_union_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," < ::Thrift::Union",0x12);
  }
  if (is_exception) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," < ::Thrift::Exception",0x16)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"; end",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_declaration(t_rb_ofstream& out, t_struct* tstruct, bool is_exception) {
  out.indent() << "class " << type_name(tstruct);
  if (tstruct->is_union()) {
    out << " < ::Thrift::Union";
  }
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << "; end" << endl << endl;
}